

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

ngx_int_t ngx_filename_cmp(u_char *s1,u_char *s2,size_t n)

{
  ulong uVar1;
  ngx_int_t nVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  if (n == 0) {
    nVar2 = 0;
  }
  else {
    lVar4 = 0;
    while( true ) {
      uVar1 = (ulong)s1[lVar4];
      uVar3 = (ulong)s2[lVar4];
      if (s1[lVar4] != s2[lVar4]) break;
      if (uVar1 == 0) {
        return 0;
      }
      bVar5 = n - 1 == lVar4;
      lVar4 = lVar4 + 1;
      if (bVar5) {
        return 0;
      }
    }
    if (uVar1 != 0 && uVar3 != 0) {
      if (uVar1 == 0x2f) {
        uVar1 = 0;
      }
      if (uVar3 == 0x2f) {
        uVar3 = 0;
      }
    }
    nVar2 = uVar1 - uVar3;
  }
  return nVar2;
}

Assistant:

ngx_int_t
ngx_filename_cmp(u_char *s1, u_char *s2, size_t n)
{
    ngx_uint_t  c1, c2;

    while (n) {
        c1 = (ngx_uint_t) *s1++;
        c2 = (ngx_uint_t) *s2++;

#if (NGX_HAVE_CASELESS_FILESYSTEM)
        c1 = tolower(c1);
        c2 = tolower(c2);
#endif

        if (c1 == c2) {

            if (c1) {
                n--;
                continue;
            }

            return 0;
        }

        /* we need '/' to be the lowest character */

        if (c1 == 0 || c2 == 0) {
            return c1 - c2;
        }

        c1 = (c1 == '/') ? 0 : c1;
        c2 = (c2 == '/') ? 0 : c2;

        return c1 - c2;
    }

    return 0;
}